

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::AddTargetObject(cmMakefile *this,string *tgtName,string *objFile)

{
  size_t sVar1;
  pointer pcVar2;
  cmSourceFile *this_00;
  string *name;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  this_00 = GetOrCreateSource(this,objFile,true,Known);
  cmSourceFile::SetObjectLibrary(this_00,tgtName);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"EXTERNAL_OBJECT","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"1","");
  cmSourceFile::SetProperty(this_00,&local_40,(string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  sVar1 = this->ObjectLibrariesSourceGroupIndex;
  pcVar2 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
           _M_impl.super__Vector_impl_data._M_start;
  name = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
  cmSourceGroup::AddGroupFile(pcVar2 + sVar1,name);
  return;
}

Assistant:

void cmMakefile::AddTargetObject(std::string const& tgtName,
                                 std::string const& objFile)
{
  cmSourceFile* sf =
    this->GetOrCreateSource(objFile, true, cmSourceFileLocationKind::Known);
  sf->SetObjectLibrary(tgtName);
  sf->SetProperty("EXTERNAL_OBJECT", "1");
  // TODO: Compute a language for this object based on the associated source
  // file that compiles to it. Needs a policy as it likely affects link
  // language selection if done unconditionally.
#if !defined(CMAKE_BOOTSTRAP)
  this->SourceGroups[this->ObjectLibrariesSourceGroupIndex].AddGroupFile(
    sf->ResolveFullPath());
#endif
}